

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::SimpleTypeHandler<6UL>::SetConfigurable
          (SimpleTypeHandler<6UL> *this,DynamicObject *instance,PropertyId propertyId,BOOL value)

{
  ScriptContext *this_00;
  bool bVar1;
  BOOL BVar2;
  int iVar3;
  DynamicTypeHandler *pDVar4;
  ushort index;
  uint32 local_38;
  uint local_34;
  uint32 indexVal;
  
  if (0 < this->propertyCount) {
    index = 0;
    do {
      if ((this->descriptors[index].Id.ptr)->pid == propertyId) {
        if (value == 0) {
          ClearAttribute(this,instance,index,'\x02');
        }
        else {
          SetAttribute(this,instance,index,'\x02');
        }
        return 1;
      }
      index = index + 1;
    } while ((uint)index < (uint)this->propertyCount);
  }
  this_00 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
            super_JavascriptLibraryBase).scriptContext.ptr;
  local_34 = value;
  bVar1 = DynamicObject::HasObjectArray(instance);
  iVar3 = 1;
  if ((bVar1) &&
     (BVar2 = ScriptContext::IsNumericPropertyId(this_00,propertyId,&local_38), BVar2 != 0)) {
    pDVar4 = ConvertToTypeWithItemAttributes(this,instance);
    iVar3 = (*pDVar4->_vptr_DynamicTypeHandler[0x2b])
                      (pDVar4,instance,(ulong)(uint)propertyId,(ulong)local_34);
  }
  return iVar3;
}

Assistant:

BOOL SimpleTypeHandler<size>::SetConfigurable(DynamicObject* instance, PropertyId propertyId, BOOL value)
    {
        PropertyIndex index;
        if (!GetDescriptor(propertyId, &index))
        {
            // Upgrade type handler if set objectArray item attribute.
            // Only check numeric propertyId if objectArray available.
            ScriptContext* scriptContext = instance->GetScriptContext();
            uint32 indexVal;
            if (instance->HasObjectArray() && scriptContext->IsNumericPropertyId(propertyId, &indexVal))
            {
                return SimpleTypeHandler<size>::ConvertToTypeWithItemAttributes(instance)
                    ->SetConfigurable(instance, propertyId, value);
            }
            return true;
        }

        if (value)
        {
            SetAttribute(instance, index, PropertyConfigurable);
        }
        else
        {
            ClearAttribute(instance, index, PropertyConfigurable);
        }
        return true;
    }